

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeGroupTo<google::protobuf::internal::ArrayOutput>
               (MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  int num_fields;
  int cached_size;
  uint8_t *base;
  FieldMetadata *field_table;
  SerializationTable *table;
  ArrayOutput *output_local;
  void *table_ptr_local;
  MessageLite *msg_local;
  
  if (table_ptr == (void *)0x0) {
    SerializeMessageNoTable(msg,output);
  }
  else {
    SerializeMessageDispatch
              (msg,(FieldMetadata *)(*(uint **)((long)table_ptr + 8) + 6),*table_ptr + -1,
               *(int32_t *)((long)&msg->_vptr_MessageLite + (ulong)**(uint **)((long)table_ptr + 8))
               ,output);
  }
  return;
}

Assistant:

void SerializeGroupTo(const MessageLite* msg, const void* table_ptr,
                      O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8_t* base = reinterpret_cast<const uint8_t*>(msg);
  int cached_size =
      *reinterpret_cast<const int32_t*>(base + field_table->offset);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}